

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void mouse_callback(GLFWwindow *window,double xpos,double ypos)

{
  float fVar1;
  double dVar2;
  double dVar3;
  vec<3,_float,_(glm::qualifier)0> vVar4;
  vec3 local_58 [2];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_38;
  float local_34;
  vec3 front;
  float sensitivity;
  float yOffset;
  float xOffset;
  double ypos_local;
  double xpos_local;
  GLFWwindow *window_local;
  
  if (firstMouse) {
    lastX = (float)xpos;
    lastY = (float)ypos;
    firstMouse = false;
  }
  dVar3 = (double)lastX;
  dVar2 = (double)lastY;
  lastX = (float)xpos;
  lastY = (float)ypos;
  front.field_1.y = 0.5;
  front.field_2.z = (float)(dVar2 - ypos) * 0.5;
  yaw = (float)(xpos - dVar3) * 0.5 + yaw;
  pitch = front.field_2.z + pitch;
  if (89.0 < pitch) {
    pitch = 89.0;
  }
  if (pitch < -89.0) {
    pitch = -89.0;
  }
  fVar1 = glm::radians<float>(yaw);
  dVar2 = cos((double)fVar1);
  fVar1 = glm::radians<float>(pitch);
  dVar3 = cos((double)fVar1);
  local_38.x = (float)(dVar2 * dVar3);
  fVar1 = glm::radians<float>(pitch);
  dVar2 = sin((double)fVar1);
  local_34 = (float)dVar2;
  fVar1 = glm::radians<float>(yaw);
  dVar2 = sin((double)fVar1);
  fVar1 = glm::radians<float>(pitch);
  dVar3 = cos((double)fVar1);
  front.field_0.x = (float)(dVar2 * dVar3);
  vVar4 = glm::normalize<3,float,(glm::qualifier)0>((vec<3,_float,_(glm::qualifier)0> *)&local_38);
  local_58[0]._0_8_ = vVar4._0_8_;
  local_58[0].field_2 = vVar4.field_2;
  cameraFront.field_0 = local_58[0].field_0;
  cameraFront.field_1 = local_58[0].field_1;
  cameraFront.field_2 = local_58[0].field_2;
  return;
}

Assistant:

static void mouse_callback(GLFWwindow* window, double xpos, double ypos){
    if(firstMouse){
        lastX = xpos;
        lastY = ypos;
        firstMouse = false;
    }
    float xOffset = xpos - lastX;
    float yOffset = lastY - ypos;//注意这个
    lastX = xpos;
    lastY = ypos;
    float sensitivity = 0.5;
    xOffset *= sensitivity;
    yOffset *= sensitivity;
    yaw   += xOffset;
    pitch += yOffset;
    if(pitch > 89.0f)
        pitch = 89.0f;
    if(pitch < -89.0f)
        pitch = -89.0f;
    glm::vec3 front;
    front.x = cos(glm::radians(yaw)) * cos(glm::radians(pitch));
    front.y = sin(glm::radians(pitch));
    front.z = sin(glm::radians(yaw)) * cos(glm::radians(pitch));
    cameraFront = glm::normalize(front);
}